

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

wstring * __thiscall
PDA::Transducer::Generator::pop_abi_cxx11_
          (wstring *__return_storage_ptr__,Generator *this,Register *dest,wchar_t suff)

{
  undefined4 in_register_0000000c;
  wstring local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)__return_storage_ptr__,L"pop",L"",CONCAT44(in_register_0000000c,suff));
  std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
  std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
  Register::toString_abi_cxx11_(&local_40,(Register *)this);
  std::__cxx11::wstring::_M_append
            ((wchar_t *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Generator::pop(const Register &dest, const wchar_t suff)
{
    std::wstring result = L"pop";
    result += suff == L'\0' ? registerSuffix(dest) : suff;
    result += L'\t';
    result += dest.toString();
    return result;
}